

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

Am_Value Am_Get_Choice_From_Dialog(Am_Value_List *prompt_texts,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object *this;
  undefined7 in_register_00000009;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined4 in_register_00000034;
  bool in_R8B;
  Am_Value AVar3;
  Am_Object the_dialog;
  Am_Value_List local_50;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  the_dialog.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Empty(&cached_choice_dialogs);
  if (bVar1) {
    Am_Object::Create((Am_Object *)&local_50,(char *)&Am_Choice_Dialog);
    Am_Object::operator=(&the_dialog,(Am_Object *)&local_50);
    Am_Object::~Am_Object((Am_Object *)&local_50);
  }
  else {
    Am_Value_List::Pop(&local_50,true);
    Am_Object::operator=(&the_dialog,(Am_Value *)&local_50);
    Am_Value::~Am_Value((Am_Value *)&local_50);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_
                     ((Am_Value_List *)CONCAT44(in_register_00000034,x));
  Am_Object::Set(&the_dialog,0xa2,pAVar2,0);
  Am_Object::Get_Object((Am_Object *)&local_50,(Am_Slot_Key)&the_dialog,0xc5);
  this = Am_Object::Set((Am_Object *)&local_50,0xca,do_stop_waiting_for_dialog.from_wrapper,0);
  Am_Object::Set(this,0xc9,do_abort_waiting_for_dialog.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  Am_Object::Am_Object(&local_30,&the_dialog);
  Am_Object::Add_Part(&Am_Screen,&local_30,true,0);
  Am_Object::~Am_Object(&local_30);
  set_dialog_position(&the_dialog,y,(int)CONCAT71(in_register_00000009,modal));
  *(undefined2 *)&prompt_texts->data = 0;
  prompt_texts->item = (Am_List_Item *)0x0;
  Am_Object::Am_Object(&local_38,&the_dialog);
  Am_Pop_Up_Window_And_Wait(&local_38,(Am_Value *)prompt_texts,in_R8B);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_40,&the_dialog);
  Am_Object::Remove_Part(&Am_Screen,&local_40);
  Am_Object::~Am_Object(&local_40);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&the_dialog);
  Am_Value_List::Push(&cached_choice_dialogs,pAVar2,true);
  Am_Object::~Am_Object(&the_dialog);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = prompt_texts;
  return AVar3;
}

Assistant:

Am_Value
Am_Get_Choice_From_Dialog(Am_Value_List prompt_texts,
                          int x /*= Am_AT_CENTER_SCREEN */,
                          int y /*= Am_AT_CENTER_SCREEN */,
                          bool modal /*=false*/)
{
  Am_Object the_dialog;
  if (cached_choice_dialogs.Empty())
    the_dialog = Am_Choice_Dialog.Create();
  else {
    the_dialog = cached_choice_dialogs.Pop();
  }

  the_dialog.Set(Am_ITEMS, prompt_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_choice_dialogs.Push(the_dialog);
  return v;
}